

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void __thiscall
bloaty::(anonymous_namespace)::SymMunger::operator()
          (undefined8 param_1,undefined8 param_2,ByteSwapFunc *param_3)

{
  ByteSwapFunc BVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_long uVar4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffde;
  uchar in_stack_ffffffffffffffdf;
  
  uVar3 = ByteSwapFunc::operator()
                    (param_3,CONCAT13(in_stack_ffffffffffffffdf,
                                      CONCAT12(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc))
                    );
  *(uint *)param_3 = uVar3;
  BVar1 = (ByteSwapFunc)ByteSwapFunc::operator()(param_3,in_stack_ffffffffffffffdf);
  param_3[4] = BVar1;
  BVar1 = (ByteSwapFunc)ByteSwapFunc::operator()(param_3,in_stack_ffffffffffffffdf);
  param_3[5] = BVar1;
  uVar2 = ByteSwapFunc::operator()
                    (param_3,CONCAT11(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde));
  *(unsigned_short *)(param_3 + 6) = uVar2;
  uVar4 = ByteSwapFunc::operator()
                    (param_3,CONCAT17(in_stack_ffffffffffffffdf,
                                      CONCAT16(in_stack_ffffffffffffffde,
                                               CONCAT24(in_stack_ffffffffffffffdc,
                                                        in_stack_ffffffffffffffd8))));
  *(unsigned_long *)(param_3 + 8) = uVar4;
  uVar4 = ByteSwapFunc::operator()
                    (param_3,CONCAT17(in_stack_ffffffffffffffdf,
                                      CONCAT16(in_stack_ffffffffffffffde,
                                               CONCAT24(in_stack_ffffffffffffffdc,
                                                        in_stack_ffffffffffffffd8))));
  *(unsigned_long *)(param_3 + 0x10) = uVar4;
  return;
}

Assistant:

void operator()(const From& from, Elf64_Sym* to, Func func) {
    to->st_name   = func(from.st_name);
    to->st_info   = func(from.st_info);
    to->st_other  = func(from.st_other);
    to->st_shndx  = func(from.st_shndx);
    to->st_value  = func(from.st_value);
    to->st_size   = func(from.st_size);
  }